

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__pnm_test(stbi__context *s)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi__context *in_RDI;
  char t;
  char p;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  undefined4 local_4;
  
  sVar1 = stbi__get8((stbi__context *)
                     CONCAT17(in_stack_ffffffffffffffef,
                              CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)));
  sVar2 = stbi__get8((stbi__context *)
                     CONCAT17(sVar1,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)));
  if ((sVar1 == 'P') && ((sVar2 == '5' || (sVar2 == '6')))) {
    local_4 = 1;
  }
  else {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int      stbi__pnm_test(stbi__context *s)
{
   char p, t;
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}